

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

int httplib::detail::write_headers<httplib::Request>(Stream *strm,Request *info,Headers *headers)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  int iVar5;
  int unaff_R14D;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  char *local_48;
  char *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var2 = (info->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(info->headers)._M_t._M_impl.super__Rb_tree_header;
  bVar7 = (_Rb_tree_header *)p_Var2 == p_Var6;
  local_38 = (_Rb_tree_node_base *)headers;
  if (bVar7) {
    iVar4 = 0;
  }
  else {
    local_40 = *(char **)(p_Var2 + 1);
    local_48 = *(char **)(p_Var2 + 2);
    iVar1 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_40,&local_48);
    iVar4 = iVar1;
    if (iVar1 < 0) {
      iVar4 = 0;
      unaff_R14D = iVar1;
    }
    else {
      do {
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        bVar7 = (_Rb_tree_header *)p_Var2 == p_Var6;
        unaff_R14D = iVar1;
        if (bVar7) break;
        local_40 = *(char **)(p_Var2 + 1);
        local_48 = *(char **)(p_Var2 + 2);
        unaff_R14D = Stream::write_format<char_const*,char_const*>
                               (strm,"%s: %s\r\n",&local_40,&local_48);
        iVar5 = 0;
        if (-1 < unaff_R14D) {
          iVar5 = unaff_R14D;
        }
        iVar4 = iVar4 + iVar5;
      } while (-1 < unaff_R14D);
    }
  }
  if (bVar7) {
    p_Var3 = (((_Rep_type *)&local_38->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
    local_38 = &(((_Rep_type *)&local_38->_M_color)->_M_impl).super__Rb_tree_header._M_header;
    bVar7 = p_Var3 == local_38;
    iVar1 = unaff_R14D;
    if (!bVar7) {
      local_40 = *(char **)(p_Var3 + 1);
      local_48 = *(char **)(p_Var3 + 2);
      iVar1 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_40,&local_48);
      iVar5 = 0;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      iVar4 = iVar5 + iVar4;
      while (-1 < iVar1) {
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        bVar7 = p_Var3 == local_38;
        iVar1 = unaff_R14D;
        if (bVar7) break;
        local_40 = *(char **)(p_Var3 + 1);
        local_48 = *(char **)(p_Var3 + 2);
        iVar1 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_40,&local_48)
        ;
        iVar5 = 0;
        if (-1 < iVar1) {
          iVar5 = iVar1;
        }
        iVar4 = iVar4 + iVar5;
      }
    }
    unaff_R14D = iVar1;
    if (bVar7) {
      iVar1 = (*strm->_vptr_Stream[4])(strm,"\r\n");
      if (iVar1 < 0) {
        iVar4 = 0;
      }
      unaff_R14D = iVar4 + iVar1;
    }
  }
  return unaff_R14D;
}

Assistant:

inline int write_headers(Stream &strm, const T &info, const Headers &headers) {
  auto write_len = 0;
  for (const auto &x : info.headers) {
    auto len =
        strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
    if (len < 0) { return len; }
    write_len += len;
  }
  for (const auto &x : headers) {
    auto len =
        strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}